

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread_pthread.c
# Opt level: O0

int evthread_posix_cond_signal(void *cond_,int broadcast)

{
  int iVar1;
  undefined4 local_24;
  int r;
  pthread_cond_t *cond;
  int broadcast_local;
  void *cond__local;
  
  if (broadcast == 0) {
    local_24 = pthread_cond_signal((pthread_cond_t *)cond_);
  }
  else {
    local_24 = pthread_cond_broadcast((pthread_cond_t *)cond_);
  }
  iVar1 = 0;
  if (local_24 != 0) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int
evthread_posix_cond_signal(void *cond_, int broadcast)
{
	pthread_cond_t *cond = cond_;
	int r;
	if (broadcast)
		r = pthread_cond_broadcast(cond);
	else
		r = pthread_cond_signal(cond);
	return r ? -1 : 0;
}